

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

Blob<224> * bitreverse<Blob<224>>(Blob<224> *n,size_t b)

{
  int iVar1;
  ulong in_RDX;
  Blob<224> *in_RSI;
  Blob<224> *in_RDI;
  size_t i;
  Blob<224> *rv;
  int in_stack_ffffffffffffff8c;
  Blob<224> *this;
  Blob<224> local_58;
  Blob<224> local_3c;
  ulong local_20;
  ulong local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  Blob<224>::Blob(in_RDI,0);
  local_20 = 0;
  while (local_20 < local_18) {
    Blob<224>::operator<<(this,(int)((ulong)in_RSI >> 0x20));
    iVar1 = Blob<224>::operator&(in_RSI,1);
    iVar1 = Blob<224>::operator|(&local_58,iVar1);
    Blob<224>::Blob(&local_3c,iVar1);
    Blob<224>::operator=(this,&local_3c);
    local_20 = local_20 + 1;
    Blob<224>::operator>>=(in_RSI,in_stack_ffffffffffffff8c);
  }
  return in_RDI;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; ++i, n >>= 1) {
        rv = (rv << 1) | (n & 0x01);
    }
    return rv;
}